

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int mt_flush_queue(BGZF *fp)

{
  int iVar1;
  bgzf_mtaux_t *pbVar2;
  worker_t *pwVar3;
  hFILE *fp_00;
  void *__src;
  ulong __n;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong totalbytes;
  
  pbVar2 = fp->mt;
  pthread_mutex_lock((pthread_mutex_t *)&pbVar2->lock);
  iVar1 = pbVar2->n_threads;
  if (0 < (long)iVar1) {
    pwVar3 = pbVar2->w;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&pwVar3->toproc + lVar5) = 1;
      lVar5 = lVar5 + 0x20;
    } while ((long)iVar1 * 0x20 != lVar5);
  }
  pbVar2->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&pbVar2->cv);
  pthread_mutex_unlock((pthread_mutex_t *)&pbVar2->lock);
  worker_aux(pbVar2->w);
  do {
  } while (pbVar2->proc_cnt < pbVar2->n_threads);
  if (0 < pbVar2->n_threads) {
    lVar5 = 0x14;
    lVar4 = 0;
    do {
      *(uint *)fp = *(uint *)fp | (uint)*(ushort *)((long)&pbVar2->w->mt + lVar5);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < pbVar2->n_threads);
  }
  if (0 < pbVar2->curr) {
    lVar5 = 0;
    do {
      fp_00 = fp->fp;
      __src = pbVar2->blk[lVar5];
      totalbytes = (ulong)pbVar2->len[lVar5];
      uVar6 = (long)fp_00->limit - (long)fp_00->begin;
      __n = totalbytes;
      if (uVar6 < totalbytes) {
        __n = uVar6;
      }
      memcpy(fp_00->begin,__src,__n);
      fp_00->begin = fp_00->begin + __n;
      if (uVar6 < totalbytes) {
        __n = hwrite2(fp_00,__src,totalbytes,__n);
      }
      if (__n != (long)pbVar2->len[lVar5]) {
        *(byte *)fp = *(byte *)fp | 4;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pbVar2->curr);
  }
  pbVar2->curr = 0;
  return -(uint)(*(short *)fp != 0);
}

Assistant:

static int mt_flush_queue(BGZF *fp)
{
    int i;
    mtaux_t *mt = fp->mt;
    // signal all the workers to compress
    pthread_mutex_lock(&mt->lock);
    for (i = 0; i < mt->n_threads; ++i) mt->w[i].toproc = 1;
    mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    // worker 0 is doing things here
    worker_aux(&mt->w[0]);
    // wait for all the threads to complete
    while (mt->proc_cnt < mt->n_threads);
    // dump data to disk
    for (i = 0; i < mt->n_threads; ++i) fp->errcode |= mt->w[i].errcode;
    for (i = 0; i < mt->curr; ++i)
        if (hwrite(fp->fp, mt->blk[i], mt->len[i]) != mt->len[i]) {
            fp->errcode |= BGZF_ERR_IO;
            break;
        }
    mt->curr = 0;
    return (fp->errcode == 0)? 0 : -1;
}